

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_Table.cc
# Opt level: O2

void __thiscall MyDB_Table::MyDB_Table(MyDB_Table *this,string *name,string *storageLocIn)

{
  (this->tableName)._M_dataplus._M_p = (pointer)&(this->tableName).field_2;
  (this->tableName)._M_string_length = 0;
  (this->tableName).field_2._M_local_buf[0] = '\0';
  (this->storageLoc)._M_dataplus._M_p = (pointer)&(this->storageLoc).field_2;
  (this->storageLoc)._M_string_length = 0;
  (this->storageLoc).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->storageLoc);
  return;
}

Assistant:

MyDB_Table :: MyDB_Table (string name, string storageLocIn) {
	tableName = name;
	storageLoc = storageLocIn;
}